

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool tinygltf::WriteGltfStream(ostream *stream,string *content)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(stream,(string *)content);
  std::endl<char,std::char_traits<char>>(poVar1);
  return *(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) == 0;
}

Assistant:

static bool WriteGltfStream(std::ostream &stream, const std::string &content) {
  stream << content << std::endl;
  return stream.good();
}